

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressBegin_usingDict(ZSTD_CCtx *cctx,void *dict,size_t dictSize,int compressionLevel)

{
  size_t sVar1;
  int local_104;
  undefined1 local_100 [8];
  ZSTD_parameters params;
  ZSTD_CCtx_params cctxParams;
  int compressionLevel_local;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_CCtx *cctx_local;
  
  ZSTD_getParams_internal
            ((ZSTD_parameters *)local_100,compressionLevel,0xffffffffffffffff,dictSize,
             ZSTD_cpm_noAttachDict);
  local_104 = compressionLevel;
  if (compressionLevel == 0) {
    local_104 = 3;
  }
  ZSTD_CCtxParams_init_internal
            ((ZSTD_CCtx_params *)&params.fParams.checksumFlag,(ZSTD_parameters *)local_100,local_104
            );
  sVar1 = ZSTD_compressBegin_internal
                    (cctx,dict,dictSize,ZSTD_dct_auto,ZSTD_dtlm_fast,(ZSTD_CDict *)0x0,
                     (ZSTD_CCtx_params *)&params.fParams.checksumFlag,0xffffffffffffffff,
                     ZSTDb_not_buffered);
  return sVar1;
}

Assistant:

size_t ZSTD_compressBegin_usingDict(ZSTD_CCtx* cctx, const void* dict, size_t dictSize, int compressionLevel)
{
    ZSTD_CCtx_params cctxParams;
    {
        ZSTD_parameters const params = ZSTD_getParams_internal(compressionLevel, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_noAttachDict);
        ZSTD_CCtxParams_init_internal(&cctxParams, &params, (compressionLevel == 0) ? ZSTD_CLEVEL_DEFAULT : compressionLevel);
    }
    DEBUGLOG(4, "ZSTD_compressBegin_usingDict (dictSize=%u)", (unsigned)dictSize);
    return ZSTD_compressBegin_internal(cctx, dict, dictSize, ZSTD_dct_auto, ZSTD_dtlm_fast, NULL,
                                       &cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, ZSTDb_not_buffered);
}